

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

int HTS_mseq(HTS_Vocoder *v)

{
  int x28;
  int x0;
  HTS_Vocoder *v_local;
  
  v->x = v->x >> 1;
  if ((v->x & 1U) == 0) {
    x0 = -1;
  }
  else {
    x0 = 1;
  }
  if ((v->x & 0x10000000U) == 0) {
    x28 = -1;
  }
  else {
    x28 = 1;
  }
  if (x0 + x28 == 0) {
    v->x = v->x | 0x80000000;
  }
  else {
    v->x = v->x & 0x7fffffff;
  }
  return x0;
}

Assistant:

static int HTS_mseq(HTS_Vocoder * v)
{
   int x0, x28;

   v->x >>= 1;
   if (v->x & B0)
      x0 = 1;
   else
      x0 = -1;
   if (v->x & B28)
      x28 = 1;
   else
      x28 = -1;
   if (x0 + x28)
      v->x &= B31_;
   else
      v->x |= B31;

   return (x0);
}